

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void * Map_Check(Map *tree,void *str,size_t size)

{
  void *pvVar1;
  size_t temp;
  Map *local_20;
  ulong local_18;
  
  local_20 = tree;
  Map_Scour(tree,str,size,&local_18,&local_20);
  if (local_18 < size) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = local_20->ID;
  }
  return pvVar1;
}

Assistant:

void* Map_Check(Map *tree, void *str,size_t size)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);

	if(temp<size)
	{
		return NULL;	
	}else
	{
		return tree->ID; //this has been set to be the last reached node
	}
}